

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_open_closeonexec_(char *pathname,int flags,uint mode)

{
  int iVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  undefined4 in_register_00000014;
  
  iVar1 = open(pathname,flags | 0x80000,CONCAT44(in_register_00000014,mode));
  if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 != 0x16)) {
    __fd = open(pathname,flags,(ulong)mode);
    iVar1 = -1;
    if ((-1 < __fd) && (iVar2 = fcntl(__fd,2,1), iVar1 = __fd, iVar2 < 0)) {
      close(__fd);
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int
evutil_open_closeonexec_(const char *pathname, int flags, unsigned mode)
{
	int fd;

#ifdef O_CLOEXEC
	fd = open(pathname, flags|O_CLOEXEC, (mode_t)mode);
	if (fd >= 0 || errno == EINVAL)
		return fd;
	/* If we got an EINVAL, fall through and try without O_CLOEXEC */
#endif
	fd = open(pathname, flags, (mode_t)mode);
	if (fd < 0)
		return -1;

#if defined(FD_CLOEXEC)
	if (fcntl(fd, F_SETFD, FD_CLOEXEC) < 0) {
		close(fd);
		return -1;
	}
#endif

	return fd;
}